

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

bool __thiscall HighsSparseMatrix::operator==(HighsSparseMatrix *this,HighsSparseMatrix *matrix)

{
  bool bVar1;
  bool bVar2;
  int *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  bool equal;
  bool local_21;
  
  local_21 = *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + 4) == in_RSI[1] &&
             *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start == *in_RSI;
  bVar1 = false;
  if (*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish == in_RSI[2]) {
    bVar1 = local_21;
  }
  bVar2 = std::operator==((vector<int,_std::allocator<int>_> *)unaff_retaddr,
                          (vector<int,_std::allocator<int>_> *)in_RDI);
  if (!bVar2) {
    bVar1 = false;
  }
  bVar2 = std::operator==((vector<int,_std::allocator<int>_> *)unaff_retaddr,
                          (vector<int,_std::allocator<int>_> *)in_RDI);
  if (!bVar2) {
    bVar1 = false;
  }
  bVar2 = std::operator==(unaff_retaddr,in_RDI);
  if (!bVar2) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HighsSparseMatrix::operator==(const HighsSparseMatrix& matrix) const {
  bool equal = true;
  equal = this->format_ == matrix.format_ && equal;
  equal = this->num_col_ == matrix.num_col_ && equal;
  equal = this->num_row_ == matrix.num_row_ && equal;
  equal = this->start_ == matrix.start_ && equal;
  equal = this->index_ == matrix.index_ && equal;
  equal = this->value_ == matrix.value_ && equal;
  return equal;
}